

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int register_ameth_gost(int nid,EVP_PKEY_ASN1_METHOD **ameth,char *pemstr,char *info)

{
  EVP_PKEY_ASN1_METHOD *pEVar1;
  char *in_RCX;
  char *in_RDX;
  long *in_RSI;
  int in_EDI;
  
  pEVar1 = EVP_PKEY_asn1_new(in_EDI,4,in_RDX,in_RCX);
  *in_RSI = (long)pEVar1;
  if (*in_RSI == 0) {
    return 0;
  }
  if (in_EDI != 0x32b) {
    if (in_EDI == 0x32f) {
      EVP_PKEY_asn1_set_free((EVP_PKEY_ASN1_METHOD *)*in_RSI,mackey_free_gost);
      EVP_PKEY_asn1_set_ctrl((EVP_PKEY_ASN1_METHOD *)*in_RSI,mac_ctrl_gost);
      return 1;
    }
    if (in_EDI != 0x331) {
      if (in_EDI == 0x3d0) {
        EVP_PKEY_asn1_set_free((EVP_PKEY_ASN1_METHOD *)*in_RSI,mackey_free_gost);
        EVP_PKEY_asn1_set_ctrl((EVP_PKEY_ASN1_METHOD *)*in_RSI,mac_ctrl_gost_12);
        return 1;
      }
      if (in_EDI - 0x3d3U < 2) {
        EVP_PKEY_asn1_set_free((EVP_PKEY_ASN1_METHOD *)*in_RSI,pkey_free_gost_ec);
        EVP_PKEY_asn1_set_private
                  ((EVP_PKEY_ASN1_METHOD *)*in_RSI,priv_decode_gost,priv_encode_gost,
                   priv_print_gost_ec);
        EVP_PKEY_asn1_set_param
                  ((EVP_PKEY_ASN1_METHOD *)*in_RSI,(param_decode *)0x0,(param_encode *)0x0,
                   param_missing_gost_ec,param_copy_gost_ec,param_cmp_gost_ec,(param_print *)0x0);
        EVP_PKEY_asn1_set_public
                  ((EVP_PKEY_ASN1_METHOD *)*in_RSI,pub_decode_gost_ec,pub_encode_gost_ec,
                   pub_cmp_gost_ec,pub_print_gost_ec,pkey_size_gost,pkey_bits_gost);
        EVP_PKEY_asn1_set_ctrl((EVP_PKEY_ASN1_METHOD *)*in_RSI,pkey_ctrl_gost);
        EVP_PKEY_asn1_set_security_bits(*in_RSI,pkey_bits_gost);
        return 1;
      }
      if (in_EDI == 0x3f9) {
        EVP_PKEY_asn1_set_free((EVP_PKEY_ASN1_METHOD *)*in_RSI,mackey_free_gost);
        EVP_PKEY_asn1_set_ctrl((EVP_PKEY_ASN1_METHOD *)*in_RSI,mac_ctrl_grasshopper);
        return 1;
      }
      if (in_EDI != 0x4a8) {
        return 1;
      }
      EVP_PKEY_asn1_set_free((EVP_PKEY_ASN1_METHOD *)*in_RSI,mackey_free_gost);
      EVP_PKEY_asn1_set_ctrl((EVP_PKEY_ASN1_METHOD *)*in_RSI,mac_ctrl_magma);
      return 1;
    }
  }
  EVP_PKEY_asn1_set_free((EVP_PKEY_ASN1_METHOD *)*in_RSI,pkey_free_gost_ec);
  EVP_PKEY_asn1_set_private
            ((EVP_PKEY_ASN1_METHOD *)*in_RSI,priv_decode_gost,priv_encode_gost,priv_print_gost_ec);
  EVP_PKEY_asn1_set_param
            ((EVP_PKEY_ASN1_METHOD *)*in_RSI,gost2001_param_decode,gost2001_param_encode,
             param_missing_gost_ec,param_copy_gost_ec,param_cmp_gost_ec,param_print_gost_ec);
  EVP_PKEY_asn1_set_public
            ((EVP_PKEY_ASN1_METHOD *)*in_RSI,pub_decode_gost_ec,pub_encode_gost_ec,pub_cmp_gost_ec,
             pub_print_gost_ec,pkey_size_gost,pkey_bits_gost);
  EVP_PKEY_asn1_set_ctrl((EVP_PKEY_ASN1_METHOD *)*in_RSI,pkey_ctrl_gost);
  EVP_PKEY_asn1_set_security_bits(*in_RSI,pkey_bits_gost);
  return 1;
}

Assistant:

int register_ameth_gost(int nid, EVP_PKEY_ASN1_METHOD **ameth,
                        const char *pemstr, const char *info)
{
    *ameth = EVP_PKEY_asn1_new(nid, ASN1_PKEY_SIGPARAM_NULL, pemstr, info);
    if (!*ameth)
        return 0;
    switch (nid) {
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
        EVP_PKEY_asn1_set_free(*ameth, pkey_free_gost_ec);
        EVP_PKEY_asn1_set_private(*ameth,
                                  priv_decode_gost, priv_encode_gost,
                                  priv_print_gost_ec);

        EVP_PKEY_asn1_set_param(*ameth,
                                gost2001_param_decode, gost2001_param_encode,
                                param_missing_gost_ec, param_copy_gost_ec,
                                param_cmp_gost_ec, param_print_gost_ec);
        EVP_PKEY_asn1_set_public(*ameth,
                                 pub_decode_gost_ec, pub_encode_gost_ec,
                                 pub_cmp_gost_ec, pub_print_gost_ec,
                                 pkey_size_gost, pkey_bits_gost);

        EVP_PKEY_asn1_set_ctrl(*ameth, pkey_ctrl_gost);
        EVP_PKEY_asn1_set_security_bits(*ameth, pkey_bits_gost);
        break;
    case NID_id_GostR3410_2012_256:
    case NID_id_GostR3410_2012_512:
        EVP_PKEY_asn1_set_free(*ameth, pkey_free_gost_ec);
        EVP_PKEY_asn1_set_private(*ameth,
                                  priv_decode_gost, priv_encode_gost,
                                  priv_print_gost_ec);

        EVP_PKEY_asn1_set_param(*ameth,
                                NULL, NULL,
                                param_missing_gost_ec, param_copy_gost_ec,
                                param_cmp_gost_ec, NULL);

        EVP_PKEY_asn1_set_public(*ameth,
                                 pub_decode_gost_ec, pub_encode_gost_ec,
                                 pub_cmp_gost_ec, pub_print_gost_ec,
                                 pkey_size_gost, pkey_bits_gost);

        EVP_PKEY_asn1_set_ctrl(*ameth, pkey_ctrl_gost);
        EVP_PKEY_asn1_set_security_bits(*ameth, pkey_bits_gost);
        break;
    case NID_id_Gost28147_89_MAC:
        EVP_PKEY_asn1_set_free(*ameth, mackey_free_gost);
        EVP_PKEY_asn1_set_ctrl(*ameth, mac_ctrl_gost);
        break;
    case NID_gost_mac_12:
        EVP_PKEY_asn1_set_free(*ameth, mackey_free_gost);
        EVP_PKEY_asn1_set_ctrl(*ameth, mac_ctrl_gost_12);
        break;
    case NID_magma_mac:
        EVP_PKEY_asn1_set_free(*ameth, mackey_free_gost);
        EVP_PKEY_asn1_set_ctrl(*ameth, mac_ctrl_magma);
        break;
    case NID_grasshopper_mac:
        EVP_PKEY_asn1_set_free(*ameth, mackey_free_gost);
        EVP_PKEY_asn1_set_ctrl(*ameth, mac_ctrl_grasshopper);
        break;
    }
    return 1;
}